

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<Branching*>::vec<Branching*>(vec<Branching*> *this,vec<Branching_*> *other)

{
  uint uVar1;
  uint i;
  void *pvVar2;
  ulong uVar3;
  
  uVar1 = other->sz;
  *(uint *)this = uVar1;
  *(uint *)(this + 4) = uVar1;
  pvVar2 = malloc((ulong)uVar1 * 8);
  *(void **)(this + 8) = pvVar2;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    *(Branching **)(*(long *)(this + 8) + uVar3 * 8) = other->data[uVar3];
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}